

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6568705364617551;
  *(undefined2 *)((long)&in_RDI->field_2 + 8) = 0x6572;
  in_RDI->_M_string_length = 10;
  (in_RDI->field_2)._M_local_buf[10] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }